

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::~QFileDialog(QFileDialog *this)

{
  QFileDialogPrivate *slot;
  QPlatformFileDialogHelper *pQVar1;
  Object *in_RDI;
  offset_in_QPlatformFileDialogHelper_to_subr unaff_retaddr;
  QPlatformFileDialogHelper *platformHelper;
  QFileDialogPrivate *d;
  QFileDialogPrivate *in_stack_000000c0;
  
  *(undefined ***)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate = &PTR_metaObject_00d22758;
  *(undefined ***)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate.field_0x10 =
       &PTR__QFileDialog_00d22930;
  slot = d_func((QFileDialog *)0x74df2b);
  QFileDialogPrivate::saveSettings(in_stack_000000c0);
  pQVar1 = QFileDialogPrivate::platformFileDialogHelper((QFileDialogPrivate *)0x74df44);
  if (pQVar1 != (QPlatformFileDialogHelper *)0x0) {
    QObjectPrivate::
    disconnect<void(QPlatformFileDialogHelper::*)(QUrl_const&),void(QFileDialogPrivate::*)(QUrl_const&)>
              ((Object *)QFileDialogPrivate::nativeEnterDirectory,unaff_retaddr,in_RDI,
               (Function)slot);
  }
  QDialog::~QDialog((QDialog *)in_RDI);
  return;
}

Assistant:

QFileDialog::~QFileDialog()
{
    Q_D(QFileDialog);
#if QT_CONFIG(settings)
    d->saveSettings();
#endif
    if (QPlatformFileDialogHelper *platformHelper = d->platformFileDialogHelper()) {
        // QIOSFileDialog emits directoryChanged while hiding, causing an assert
        // because of a partially destroyed QFileDialog.
        QObjectPrivate::disconnect(platformHelper, &QPlatformFileDialogHelper::directoryEntered,
                                   d, &QFileDialogPrivate::nativeEnterDirectory);
    }
}